

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

void __thiscall
SQFuncState::SQFuncState
          (SQFuncState *this,SQSharedState *ss,SQFuncState *parent,CompilerErrorFunc efunc,void *ed)

{
  SQSharedState *ss_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  SQInteger in_stack_ffffffffffffff18;
  SQSharedState *in_stack_ffffffffffffff20;
  SQTable *x;
  sqvector<long_long> *this_00;
  
  sqvector<SQLocalVarInfo>::sqvector((sqvector<SQLocalVarInfo> *)(in_RDI + 1));
  sqvector<long_long>::sqvector((sqvector<long_long> *)(in_RDI + 4));
  sqvector<long_long>::sqvector((sqvector<long_long> *)(in_RDI + 9));
  sqvector<long_long>::sqvector((sqvector<long_long> *)(in_RDI + 0xc));
  sqvector<SQObjectPtr>::sqvector((sqvector<SQObjectPtr> *)(in_RDI + 0xf));
  sqvector<SQObjectPtr>::sqvector((sqvector<SQObjectPtr> *)(in_RDI + 0x12));
  sqvector<SQOuterVar>::sqvector((sqvector<SQOuterVar> *)(in_RDI + 0x15));
  sqvector<SQInstruction>::sqvector((sqvector<SQInstruction> *)(in_RDI + 0x18));
  sqvector<SQLocalVarInfo>::sqvector((sqvector<SQLocalVarInfo> *)(in_RDI + 0x1b));
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)(in_RDI + 0x1e));
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)(in_RDI + 0x20));
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)(in_RDI + 0x22));
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)(in_RDI + 0x24));
  sqvector<SQLineInfo>::sqvector((sqvector<SQLineInfo> *)(in_RDI + 0x27));
  sqvector<long_long>::sqvector((sqvector<long_long> *)(in_RDI + 0x2b));
  sqvector<long_long>::sqvector((sqvector<long_long> *)(in_RDI + 0x2e));
  sqvector<long_long>::sqvector((sqvector<long_long> *)(in_RDI + 0x31));
  this_00 = (sqvector<long_long> *)(in_RDI + 0x34);
  sqvector<long_long>::sqvector(this_00);
  x = (SQTable *)(in_RDI + 0x3c);
  sqvector<SQFuncState_*>::sqvector((sqvector<SQFuncState_*> *)x);
  in_RDI[0x26] = 0;
  ss_00 = (SQSharedState *)SQTable::Create(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  ::SQObjectPtr::operator=((SQObjectPtr *)this_00,x);
  SQTable::Create(ss_00,in_stack_ffffffffffffff18);
  ::SQObjectPtr::operator=((SQObjectPtr *)this_00,x);
  in_RDI[0x3b] = in_RSI;
  in_RDI[0x37] = 0;
  *(undefined1 *)(in_RDI + 0x3a) = 1;
  in_RDI[0x2a] = in_RDX;
  in_RDI[7] = 0;
  in_RDI[0x38] = 0;
  *in_RDI = 0;
  *(undefined1 *)(in_RDI + 8) = 0;
  in_RDI[0x3f] = in_RCX;
  in_RDI[0x40] = in_R8;
  *(undefined1 *)((long)in_RDI + 0x41) = 0;
  in_RDI[0x39] = 0;
  in_RDI[0x41] = in_RSI;
  return;
}

Assistant:

SQFuncState::SQFuncState(SQSharedState *ss,SQFuncState *parent,CompilerErrorFunc efunc,void *ed)
{
        _nliterals = 0;
        _literals = SQTable::Create(ss,0);
        _strings =  SQTable::Create(ss,0);
        _sharedstate = ss;
        _lastline = 0;
        _optimization = true;
        _parent = parent;
        _stacksize = 0;
        _traps = 0;
        _returnexp = 0;
        _varparams = false;
        _errfunc = efunc;
        _errtarget = ed;
        _bgenerator = false;
        _outers = 0;
        _ss = ss;

}